

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_manager.cc
# Opt level: O2

RC __thiscall QL_Manager::ParseSelectAttrs(QL_Manager *this,int nSelAttrs,RelAttr *selAttrs)

{
  char *__s;
  bool bVar1;
  int iVar2;
  size_t __n;
  long lVar3;
  RelAttr attr;
  
  if (nSelAttrs == 1) {
    __s = selAttrs->attrName;
    __n = strlen(__s);
    iVar2 = strncmp(__s,"*",__n);
    if (iVar2 == 0) {
      return 0;
    }
  }
  if (nSelAttrs < 1) {
    nSelAttrs = 0;
  }
  lVar3 = 0;
  do {
    if ((ulong)(uint)nSelAttrs * 0x10 + 0x10 == lVar3 + 0x10) {
      return 0;
    }
    attr.attrName = *(char **)((long)&selAttrs->attrName + lVar3);
    attr.relName = *(char **)((long)&selAttrs->relName + lVar3);
    bVar1 = IsValidAttr(this,attr);
    lVar3 = lVar3 + 0x10;
  } while (bVar1);
  return 0x194;
}

Assistant:

RC QL_Manager::ParseSelectAttrs(int nSelAttrs, const RelAttr selAttrs[]){
  // If it's select *, then it's valid
  if((nSelAttrs == 1 && strncmp(selAttrs[0].attrName, "*", strlen(selAttrs[0].attrName)) == 0))
    return (0);

  for(int i=0; i < nSelAttrs; i++){
    // Check that attribute name is valid:
    if(!IsValidAttr(selAttrs[i]))
      return (QL_ATTRNOTFOUND);  

  }
  return (0);
}